

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.cpp
# Opt level: O1

void AudioBackend_SetSoundVolume(AudioBackend_Sound *sound,long volume)

{
  long lVar1;
  float fVar2;
  double dVar3;
  
  if (sound != (AudioBackend_Sound *)0x0) {
    if (mutex.pContext != (ma_context *)0x0) {
      (*((mutex.pContext)->field_22).posix.pthread_mutex_lock)(0x12a818);
    }
    lVar1 = -10000;
    if (-10000 < volume) {
      lVar1 = volume;
    }
    dVar3 = pow(10.0,(double)(int)((uint)(lVar1 >> 0x3f) & (uint)lVar1) / 2000.0);
    fVar2 = (float)dVar3;
    sound->volume = fVar2;
    sound->volume_l = sound->pan_l * fVar2;
    sound->volume_r = fVar2 * sound->pan_r;
    if (mutex.pContext != (ma_context *)0x0) {
      (*((mutex.pContext)->field_22).posix.pthread_mutex_unlock)(0x12a818);
      return;
    }
  }
  return;
}

Assistant:

void AudioBackend_SetSoundVolume(AudioBackend_Sound *sound, long volume)
{
	if (sound == NULL)
		return;

	ma_mutex_lock(&mutex);

	SetSoundVolume(sound, volume);

	ma_mutex_unlock(&mutex);
}